

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

void value_free(CONF_VALUE *value)

{
  CONF_VALUE *value_local;
  
  if (value != (CONF_VALUE *)0x0) {
    OPENSSL_free(value->section);
    OPENSSL_free(value->name);
    OPENSSL_free(value->value);
    OPENSSL_free(value);
  }
  return;
}

Assistant:

static void value_free(CONF_VALUE *value) {
  if (value == NULL) {
    return;
  }
  OPENSSL_free(value->section);
  OPENSSL_free(value->name);
  OPENSSL_free(value->value);
  OPENSSL_free(value);
}